

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O2

double __thiscall icu_63::MessagePattern::getNumericValue(MessagePattern *this,Part *part)

{
  if (part->type == UMSGPAT_PART_TYPE_ARG_DOUBLE) {
    return this->numericValues[part->value];
  }
  if (part->type == UMSGPAT_PART_TYPE_ARG_INT) {
    return (double)(int)part->value;
  }
  return -123456789.0;
}

Assistant:

double
MessagePattern::getNumericValue(const Part &part) const {
    UMessagePatternPartType type=part.type;
    if(type==UMSGPAT_PART_TYPE_ARG_INT) {
        return part.value;
    } else if(type==UMSGPAT_PART_TYPE_ARG_DOUBLE) {
        return numericValues[part.value];
    } else {
        return UMSGPAT_NO_NUMERIC_VALUE;
    }
}